

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O2

bool __thiscall
Fossilize::FeatureFilter::Impl::render_pass2_is_supported(Impl *this,VkRenderPassCreateInfo2 *info)

{
  uint *puVar1;
  VkSubpassDescription2 *pVVar2;
  bool bVar3;
  size_type sVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  int *piVar8;
  int *piVar9;
  long lVar10;
  uint32_t i;
  ulong uVar11;
  allocator local_49;
  key_type local_48;
  
  if ((info->flags & 0xfffffffd) != 0) {
    return false;
  }
  if (info->flags != 0) {
    std::__cxx11::string::string((string *)&local_48,"VK_QCOM_render_pass_transform",&local_49);
    sVar4 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::count((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)this,&local_48);
    std::__cxx11::string::_M_dispose();
    if (sVar4 == 0) {
      return false;
    }
  }
  if (this->null_device != false) {
    return true;
  }
  std::__cxx11::string::string((string *)&local_48,"VK_KHR_create_renderpass2",&local_49);
  sVar4 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)this,&local_48);
  if (sVar4 == 0) {
    uVar6 = this->api_version;
    std::__cxx11::string::_M_dispose();
    if (uVar6 < 0x402000) {
      return false;
    }
  }
  else {
    std::__cxx11::string::_M_dispose();
  }
  bVar3 = pnext_chain_is_supported(this,info->pNext);
  if (!bVar3) {
    return false;
  }
  uVar11 = 0;
  do {
    if (info->attachmentCount <= uVar11) {
      uVar11 = 0xffffffffffffffff;
      lVar10 = 0;
      do {
        uVar11 = uVar11 + 1;
        if (info->subpassCount <= uVar11) {
          uVar11 = 0xffffffffffffffff;
          lVar10 = 0;
          do {
            uVar11 = uVar11 + 1;
            if (info->dependencyCount <= uVar11) {
              uVar6 = (this->props).multiview.maxMultiviewViewCount;
              uVar5 = 0;
              uVar11 = (ulong)(uint)(-1 << ((byte)uVar6 & 0x1f));
              if (0x1f < uVar6) {
                uVar11 = uVar5;
              }
              do {
                bVar3 = info->correlatedViewMaskCount == uVar5;
                if (bVar3) {
                  return bVar3;
                }
                puVar1 = info->pCorrelatedViewMasks + uVar5;
                uVar5 = uVar5 + 1;
              } while ((*puVar1 & (uint)uVar11) == 0);
              return bVar3;
            }
            bVar3 = subpass_dependency2_is_supported
                              (this,(VkSubpassDependency2 *)
                                    ((long)&info->pDependencies->sType + lVar10));
            lVar10 = lVar10 + 0x30;
          } while (bVar3);
          return false;
        }
        bVar3 = subpass_description2_is_supported
                          (this,(VkSubpassDescription2 *)((long)&info->pSubpasses->sType + lVar10));
        lVar10 = lVar10 + 0x58;
      } while (bVar3);
      return false;
    }
    uVar5 = 0;
    uVar6 = 0;
LAB_0010fda6:
    if (uVar5 != info->subpassCount) {
      pVVar2 = info->pSubpasses;
      for (lVar10 = 0; (ulong)pVVar2[uVar5].colorAttachmentCount << 5 != lVar10;
          lVar10 = lVar10 + 0x20) {
        uVar7 = uVar6 | 0x80;
        if (uVar11 == *(uint *)((long)&(pVVar2[uVar5].pColorAttachments)->attachment + lVar10)) {
          uVar6 = uVar7;
        }
        if ((pVVar2[uVar5].pResolveAttachments != (VkAttachmentReference2 *)0x0) &&
           (uVar11 == *(uint *)((long)&(pVVar2[uVar5].pResolveAttachments)->attachment + lVar10))) {
          uVar6 = uVar7;
        }
      }
      for (lVar10 = 0; (ulong)pVVar2[uVar5].inputAttachmentCount << 5 != lVar10;
          lVar10 = lVar10 + 0x20) {
        uVar6 = uVar6 | uVar11 == *(uint *)((long)&(pVVar2[uVar5].pInputAttachments)->attachment +
                                           lVar10);
      }
      if ((pVVar2[uVar5].pDepthStencilAttachment != (VkAttachmentReference2 *)0x0) &&
         (uVar11 == (pVVar2[uVar5].pDepthStencilAttachment)->attachment)) {
        uVar6 = uVar6 | 0x200;
      }
      piVar8 = (int *)pVVar2[uVar5].pNext;
      for (piVar9 = piVar8; piVar9 != (int *)0x0; piVar9 = *(int **)(piVar9 + 2)) {
        if (*piVar9 == 0x3b9dd359) {
          if ((*(long *)(piVar9 + 6) != 0) && (uVar11 == *(uint *)(*(long *)(piVar9 + 6) + 0x10))) {
            uVar6 = uVar6 | 0x200;
          }
          break;
        }
      }
      do {
        if (piVar8 == (int *)0x0) goto LAB_0010feb0;
        if (*piVar8 == 0x3b9e3cd0) {
          if ((*(long *)(piVar8 + 4) != 0) && (uVar11 == *(uint *)(*(long *)(piVar8 + 4) + 0x10))) {
            uVar6 = uVar6 | 0x40000000;
          }
          goto LAB_0010feb0;
        }
        piVar8 = *(int **)(piVar8 + 2);
      } while( true );
    }
    bVar3 = attachment_description2_is_supported(this,info->pAttachments + uVar11,uVar6);
    uVar11 = uVar11 + 1;
    if (!bVar3) {
      return false;
    }
  } while( true );
LAB_0010feb0:
  uVar5 = uVar5 + 1;
  goto LAB_0010fda6;
}

Assistant:

bool FeatureFilter::Impl::render_pass2_is_supported(const VkRenderPassCreateInfo2 *info) const
{
	// Only allow flags we recognize and validate.
	constexpr VkRenderPassCreateFlags supported_flags = VK_RENDER_PASS_CREATE_TRANSFORM_BIT_QCOM;
	if ((info->flags & ~supported_flags) != 0)
		return false;

	if ((info->flags & VK_RENDER_PASS_CREATE_TRANSFORM_BIT_QCOM) != 0 &&
	    enabled_extensions.count(VK_QCOM_RENDER_PASS_TRANSFORM_EXTENSION_NAME) == 0)
		return false;

	if (null_device)
		return true;

	if (!enabled_extensions.count(VK_KHR_CREATE_RENDERPASS_2_EXTENSION_NAME) && api_version < VK_API_VERSION_1_2)
		return false;

	if (!pnext_chain_is_supported(info->pNext))
		return false;

	for (uint32_t i = 0; i < info->attachmentCount; i++)
	{
		VkFormatFeatureFlags format_features = 0;

		for (uint32_t j = 0; j < info->subpassCount; j++)
		{
			for (uint32_t k = 0; k < info->pSubpasses[j].colorAttachmentCount; k++)
			{
				if (info->pSubpasses[j].pColorAttachments[k].attachment == i)
					format_features |= VK_FORMAT_FEATURE_COLOR_ATTACHMENT_BIT;

				if (info->pSubpasses[j].pResolveAttachments &&
				    info->pSubpasses[j].pResolveAttachments[k].attachment == i)
				{
					format_features |= VK_FORMAT_FEATURE_COLOR_ATTACHMENT_BIT;
				}
			}

			for (uint32_t k = 0; k < info->pSubpasses[j].inputAttachmentCount; k++)
				if (info->pSubpasses[j].pInputAttachments[k].attachment == i)
					format_features |= VK_FORMAT_FEATURE_SAMPLED_IMAGE_BIT;

			if (info->pSubpasses[j].pDepthStencilAttachment &&
			    info->pSubpasses[j].pDepthStencilAttachment->attachment == i)
			{
				format_features |= VK_FORMAT_FEATURE_DEPTH_STENCIL_ATTACHMENT_BIT;
			}

			auto *ds_resolve = find_pnext<VkSubpassDescriptionDepthStencilResolve>(
					VK_STRUCTURE_TYPE_SUBPASS_DESCRIPTION_DEPTH_STENCIL_RESOLVE, info->pSubpasses[j].pNext);
			if (ds_resolve &&
			    ds_resolve->pDepthStencilResolveAttachment &&
			    ds_resolve->pDepthStencilResolveAttachment->attachment == i)
			{
				format_features |= VK_FORMAT_FEATURE_DEPTH_STENCIL_ATTACHMENT_BIT;
			}

			auto *rate_attachment = find_pnext<VkFragmentShadingRateAttachmentInfoKHR>(
					VK_STRUCTURE_TYPE_FRAGMENT_SHADING_RATE_ATTACHMENT_INFO_KHR, info->pSubpasses[j].pNext);
			if (rate_attachment &&
			    rate_attachment->pFragmentShadingRateAttachment &&
			    rate_attachment->pFragmentShadingRateAttachment->attachment == i)
			{
				format_features |= VK_FORMAT_FEATURE_FRAGMENT_SHADING_RATE_ATTACHMENT_BIT_KHR;
			}
		}

		if (!attachment_description2_is_supported(info->pAttachments[i], format_features))
			return false;
	}

	for (uint32_t i = 0; i < info->subpassCount; i++)
	{
		if (!subpass_description2_is_supported(info->pSubpasses[i]))
			return false;
	}

	for (uint32_t i = 0; i < info->dependencyCount; i++)
	{
		if (!subpass_dependency2_is_supported(info->pDependencies[i]))
			return false;
	}

	for (uint32_t i = 0; i < info->correlatedViewMaskCount; i++)
		if (!multiview_mask_is_supported(info->pCorrelatedViewMasks[i]))
			return false;

	return true;
}